

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFileTest.cpp
# Opt level: O3

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
EvilConfig::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          EvilConfig *this,istream *param_1)

{
  FileError *this_00;
  string local_40;
  
  this_00 = (FileError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"evil","");
  CLI::FileError::FileError(this_00,&local_40);
  __cxa_throw(this_00,&CLI::FileError::typeinfo,CLI::Error::~Error);
}

Assistant:

std::vector<CLI::ConfigItem> from_config(std::istream &) const override { throw CLI::FileError("evil"); }